

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

point3f tinyusdz::geometric_normal(point3f *p0,point3f *p1,point3f *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  point3f pVar8;
  
  fVar1 = p1->x - p0->x;
  fVar6 = p1->y - p0->y;
  fVar5 = p1->z - p0->z;
  fVar4 = p2->x - p0->x;
  fVar2 = p2->y - p0->y;
  fVar3 = p2->z - p0->z;
  fVar7 = fVar6 * fVar3 - fVar2 * fVar5;
  fVar5 = fVar5 * fVar4 - fVar3 * fVar1;
  fVar2 = fVar2 * fVar1 - fVar4 * fVar6;
  fVar3 = fVar2 * fVar2 + fVar7 * fVar7 + fVar5 * fVar5;
  fVar1 = 0.0;
  if (1.1920929e-07 < fVar3) {
    if (fVar3 < 0.0) {
      fVar1 = sqrtf(fVar3);
    }
    else {
      fVar1 = SQRT(fVar3);
    }
  }
  if (fVar1 <= 1.1920929e-07) {
    fVar1 = 1.1920929e-07;
  }
  pVar8.z = fVar2 / fVar1;
  pVar8.y = fVar5 / fVar1;
  pVar8.x = fVar7 / fVar1;
  return pVar8;
}

Assistant:

value::point3f geometric_normal(const value::point3f &p0, const value::point3f &p1, const value::point3f &p2)
{
  value::point3f n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}